

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void testComp(string *tempdir,exr_compression_t comp)

{
  char *in_stack_00000018;
  pixels p;
  pixels *in_stack_ffffffffffffff30;
  pixels *in_stack_ffffffffffffff50;
  pixels *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  pixels *in_stack_ffffffffffffff90;
  
  pixels::pixels(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff84);
  pixels::fillZero(in_stack_ffffffffffffff30);
  testWriteRead((pixels *)
                p.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,(string *)p._8_8_,p._h,in_stack_00000018);
  pixels::fillPattern1(in_stack_ffffffffffffff50);
  testWriteRead((pixels *)
                p.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,(string *)p._8_8_,p._h,in_stack_00000018);
  pixels::fillPattern2(in_stack_ffffffffffffff70);
  testWriteRead((pixels *)
                p.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,(string *)p._8_8_,p._h,in_stack_00000018);
  pixels::fillRandom(in_stack_ffffffffffffff50);
  testWriteRead((pixels *)
                p.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,(string *)p._8_8_,p._h,in_stack_00000018);
  pixels::~pixels(in_stack_ffffffffffffff30);
  return;
}

Assistant:

static void
testComp (const std::string& tempdir, exr_compression_t comp)
{
    pixels p{IMG_WIDTH, IMG_HEIGHT, IMG_STRIDE_X};

    p.fillZero ();
    testWriteRead (p, tempdir, comp, "zeroes");
    p.fillPattern1 ();
    testWriteRead (p, tempdir, comp, "pattern1");
    p.fillPattern2 ();
    testWriteRead (p, tempdir, comp, "pattern2");
    p.fillRandom ();
    testWriteRead (p, tempdir, comp, "random");
}